

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

void __thiscall Js::JavascriptGenerator::Finalize(JavascriptGenerator *this,bool isShutdown)

{
  ScriptContext *this_00;
  Recycler *this_01;
  InterpreterStackFrame **ppIVar1;
  Recycler *recycler;
  bool isShutdown_local;
  JavascriptGenerator *this_local;
  
  if (((DAT_01eca37e & 1) != 0) && (!isShutdown)) {
    this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_01 = ScriptContext::GetRecycler(this_00);
    ppIVar1 = Memory::WriteBarrierPtr::operator_cast_to_InterpreterStackFrame__
                        ((WriteBarrierPtr *)&this->frame);
    if (*ppIVar1 != (InterpreterStackFrame *)0x0) {
      ppIVar1 = Memory::WriteBarrierPtr::operator_cast_to_InterpreterStackFrame__
                          ((WriteBarrierPtr *)&this->frame);
      Memory::Recycler::UnRegisterPendingWriteBarrierBlock(this_01,*ppIVar1);
    }
    if ((this->args).Values != (Type)0x0) {
      Memory::Recycler::UnRegisterPendingWriteBarrierBlock(this_01,(this->args).Values);
    }
  }
  return;
}

Assistant:

void JavascriptGenerator::Finalize(bool isShutdown)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && !isShutdown)
    {
        auto* recycler = GetScriptContext()->GetRecycler();
        
        if (this->frame)
            recycler->UnRegisterPendingWriteBarrierBlock(this->frame);

        if (this->args.Values)
            recycler->UnRegisterPendingWriteBarrierBlock(this->args.Values);
    }
}